

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

void __thiscall doublechecked::Roaring::flip(Roaring *this,uint64_t range_start,uint64_t range_end)

{
  const_iterator __position;
  bool bVar1;
  reference puVar2;
  ulong in_RDX;
  ulong in_RSI;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  uint64_t i;
  iterator it_end;
  iterator hint;
  Roaring *in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  ulong local_38;
  _Self local_30;
  undefined4 local_24;
  _Self local_20;
  ulong local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  roaring::Roaring::flip(in_stack_ffffffffffffffa0,(uint64_t)in_RDI,0x104c6b);
  if (local_10 < local_18) {
    if (0xffffffff < local_18) {
      local_18 = 0x100000000;
    }
    local_24 = (undefined4)local_10;
    local_20._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::lower_bound
                   (in_stack_ffffffffffffffa8._M_node,(key_type *)in_stack_ffffffffffffffa0);
    local_30._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end(in_RDI)
    ;
    for (local_38 = local_10; local_38 < local_18; local_38 = local_38 + 1) {
      bVar1 = std::operator==(&local_20,&local_30);
      if ((bVar1) ||
         (puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                             ((_Rb_tree_const_iterator<unsigned_int> *)0x104d04), local_38 < *puVar2
         )) {
        __position._M_node._4_4_ = (int)local_38;
        __position._M_node._0_4_ = in_stack_ffffffffffffffb8;
        in_stack_ffffffffffffffb0 =
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                       (in_stack_ffffffffffffffb0._M_node,__position,
                        &(in_stack_ffffffffffffffa8._M_node)->_M_color);
      }
      else {
        in_stack_ffffffffffffffa8 =
             std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
             erase_abi_cxx11_(local_20._M_node,in_stack_ffffffffffffffa8._M_node);
        local_20._M_node = in_stack_ffffffffffffffa8._M_node;
      }
    }
  }
  return;
}

Assistant:

void flip(uint64_t range_start, uint64_t range_end) {
        plain.flip(range_start, range_end);

        if (range_start < range_end) {
            if (range_end >= UINT64_C(0x100000000))
                range_end = UINT64_C(0x100000000);
            auto hint = check.lower_bound(range_start);  // *hint stays as >= i
            auto it_end = check.end();
            for (uint64_t i = range_start; i < range_end; ++i) {
                if (hint == it_end || *hint > i)  // i not present, so add
                    check.insert(hint, i);        // leave hint past i
                else  // *hint == i, must adjust hint and erase
                    hint = check.erase(hint);  // returns *following* iterator
            }
        }
    }